

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  uint32_t uVar1;
  int local_1c;
  
  local_1c = value;
  if ((field->field_0x1 & 8) == 0) {
    SetField<int>(this,message,field,&local_1c);
    return;
  }
  uVar1 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  protobuf::internal::ExtensionSet::SetEnum
            ((ExtensionSet *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
             field->number_,field->type_,value,field);
  return;
}

Assistant:

void Reflection::SetEnumValueInternal(Message* message,
                                      const FieldDescriptor* field,
                                      int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetEnum(field->number(), field->type(), value,
                                          field);
  } else {
    SetField<int>(message, field, value);
  }
}